

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O3

StatusOr<bool> * __thiscall
draco::PlyReader::ParseProperty
          (StatusOr<bool> *__return_storage_ptr__,PlyReader *this,DecoderBuffer *buffer)

{
  bool bVar1;
  undefined8 uVar2;
  int iVar3;
  DataType data_type;
  DataType list_type;
  PlyReader *pPVar4;
  pointer pPVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  string data_type_str;
  string line;
  string property_name;
  string list_type_str;
  DecoderBuffer line_buffer;
  undefined1 local_180 [24];
  _Base_ptr *local_168;
  long local_160;
  _Base_ptr local_158 [2];
  undefined1 local_148 [32];
  undefined1 local_128 [16];
  undefined1 local_118 [24];
  string local_100 [8];
  _Base_ptr local_f8;
  pointer local_f0;
  pointer local_e8;
  _Base_ptr local_d8;
  void *local_d0;
  _Base_ptr local_c0;
  undefined1 local_a8 [32];
  string local_88;
  DecoderBuffer local_68;
  
  if ((this->elements_).super__Vector_base<draco::PlyElement,_std::allocator<draco::PlyElement>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->elements_).super__Vector_base<draco::PlyElement,_std::allocator<draco::PlyElement>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->status_).code_ = OK;
    (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
    (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
    (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->value_ = false;
    return __return_storage_ptr__;
  }
  local_68.bit_mode_ = buffer->bit_mode_;
  local_68._49_1_ = buffer->field_0x31;
  local_68.bitstream_version_ = buffer->bitstream_version_;
  local_68._52_4_ = *(undefined4 *)&buffer->field_0x34;
  local_68.data_ = buffer->data_;
  local_68.data_size_ = buffer->data_size_;
  local_68.pos_ = buffer->pos_;
  local_68.bit_decoder_.bit_buffer_ = (buffer->bit_decoder_).bit_buffer_;
  local_68.bit_decoder_.bit_buffer_end_ = (buffer->bit_decoder_).bit_buffer_end_;
  local_68.bit_decoder_.bit_offset_ = (buffer->bit_decoder_).bit_offset_;
  local_128._0_8_ = local_118;
  local_128._8_8_ = (pointer)0x0;
  local_118[0] = '\0';
  pPVar4 = (PlyReader *)local_128;
  parser::ParseLine(&local_68,(string *)pPVar4);
  local_148._0_8_ = local_148 + 0x10;
  local_148._8_8_ = 0;
  local_148[0x10] = kLittleEndian;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_a8._8_8_ = (pointer)0x0;
  local_a8[0x10] = '\0';
  pPVar5 = (pointer)local_180;
  local_a8._0_8_ = local_a8 + 0x10;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  SplitWords((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)pPVar5,pPVar4,(string *)local_128);
  if (((ulong)(local_180._8_8_ - local_180._0_8_) < 0x41) ||
     (pPVar5 = (pointer)local_180._0_8_,
     iVar3 = std::__cxx11::string::compare((char *)local_180._0_8_), iVar3 != 0)) {
LAB_0011e7c2:
    bVar1 = false;
  }
  else {
    pPVar5 = (pointer)(local_180._0_8_ + 0x20);
    iVar3 = std::__cxx11::string::compare((char *)pPVar5);
    if (iVar3 == 0) goto LAB_0011e7c2;
    std::__cxx11::string::_M_assign((string *)local_148);
    pPVar5 = (pointer)local_a8;
    std::__cxx11::string::_M_assign((string *)pPVar5);
    bVar1 = true;
  }
  if (((ulong)(local_180._8_8_ - local_180._0_8_) < 0x81) ||
     (pPVar5 = (pointer)local_180._0_8_,
     iVar3 = std::__cxx11::string::compare((char *)local_180._0_8_), iVar3 != 0)) {
LAB_0011e804:
    if (!bVar1) {
      (__return_storage_ptr__->status_).code_ = OK;
      (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
      (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
      (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
      __return_storage_ptr__->value_ = false;
      goto LAB_0011eace;
    }
    data_type = GetDataTypeFromString((PlyReader *)pPVar5,(string *)local_148);
    if (data_type != DT_INVALID) {
      list_type = DT_INVALID;
LAB_0011e823:
      pPVar5 = (this->elements_).
               super__Vector_base<draco::PlyElement,_std::allocator<draco::PlyElement>_>._M_impl.
               super__Vector_impl_data._M_finish;
      PlyProperty::PlyProperty
                ((PlyProperty *)(local_118 + 0x10),(string *)local_a8,data_type,list_type);
      PlyElement::AddProperty(pPVar5 + -1,(PlyProperty *)(local_118 + 0x10));
      if (local_d0 != (void *)0x0) {
        operator_delete(local_d0,(long)local_c0 - (long)local_d0);
      }
      if (local_e8 != (pointer)0x0) {
        operator_delete(local_e8,(long)local_d8 - (long)local_e8);
      }
      if ((_Base_ptr *)CONCAT44(local_118._20_4_,local_118._16_4_) != &local_f8) {
        operator_delete((_Base_ptr *)CONCAT44(local_118._20_4_,local_118._16_4_),
                        (ulong)((long)&local_f8->_M_color + 1));
      }
      uVar2 = local_68._48_8_;
      buffer->bit_mode_ = local_68.bit_mode_;
      buffer->field_0x31 = local_68._49_1_;
      buffer->bitstream_version_ = local_68.bitstream_version_;
      (buffer->bit_decoder_).bit_buffer_end_ = local_68.bit_decoder_.bit_buffer_end_;
      (buffer->bit_decoder_).bit_offset_ = local_68.bit_decoder_.bit_offset_;
      buffer->pos_ = local_68.pos_;
      (buffer->bit_decoder_).bit_buffer_ = local_68.bit_decoder_.bit_buffer_;
      buffer->data_ = local_68.data_;
      buffer->data_size_ = local_68.data_size_;
      (__return_storage_ptr__->status_).code_ = OK;
      (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
      (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
      (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
      __return_storage_ptr__->value_ = true;
      local_68._48_8_ = uVar2;
      goto LAB_0011eace;
    }
LAB_0011ea15:
    local_168 = local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_168,"Wrong property data type","");
    local_118._16_4_ = 0xfffffffd;
    local_100 = (string  [8])&local_f0;
    std::__cxx11::string::_M_construct<char*>(local_100,local_168,local_160 + (long)local_168);
    (__return_storage_ptr__->status_).code_ = local_118._16_4_;
    (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(__return_storage_ptr__->status_).error_msg_,local_100,
               (long)&local_f8->_M_color + (long)local_100);
  }
  else {
    pPVar5 = (pointer)(local_180._0_8_ + 0x20);
    iVar3 = std::__cxx11::string::compare((char *)pPVar5);
    if (iVar3 != 0) goto LAB_0011e804;
    std::__cxx11::string::_M_assign((string *)(local_a8 + 0x20));
    std::__cxx11::string::_M_assign((string *)local_148);
    pPVar4 = (PlyReader *)local_a8;
    std::__cxx11::string::_M_assign((string *)pPVar4);
    data_type = GetDataTypeFromString(pPVar4,(string *)local_148);
    if (data_type == DT_INVALID) goto LAB_0011ea15;
    list_type = GetDataTypeFromString(pPVar4,(string *)(local_a8 + 0x20));
    if (list_type != DT_INVALID) goto LAB_0011e823;
    local_168 = local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_168,"Wrong property list type","");
    local_118._16_4_ = 0xfffffffd;
    local_100 = (string  [8])&local_f0;
    std::__cxx11::string::_M_construct<char*>(local_100,local_168,local_160 + (long)local_168);
    (__return_storage_ptr__->status_).code_ = local_118._16_4_;
    (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(__return_storage_ptr__->status_).error_msg_,local_100,
               (long)&local_f8->_M_color + (long)local_100);
  }
  if (local_100 != (string  [8])&local_f0) {
    operator_delete((void *)local_100,(ulong)((long)&(local_f0->name_)._M_dataplus._M_p + 1));
  }
  if (local_168 != local_158) {
    operator_delete(local_168,(ulong)((long)&local_158[0]->_M_color + 1));
  }
LAB_0011eace:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_180);
  if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
    operator_delete((void *)local_a8._0_8_,CONCAT71(local_a8._17_7_,local_a8[0x10]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  if ((_Base_ptr)local_148._0_8_ != (_Base_ptr)(local_148 + 0x10)) {
    operator_delete((void *)local_148._0_8_,CONCAT71(local_148._17_7_,local_148[0x10]) + 1);
  }
  if ((pointer)local_128._0_8_ != (pointer)local_118) {
    operator_delete((void *)local_128._0_8_,CONCAT71(local_118._1_7_,local_118[0]) + 1);
  }
  DecoderBuffer::BitDecoder::~BitDecoder(&local_68.bit_decoder_);
  return __return_storage_ptr__;
}

Assistant:

StatusOr<bool> PlyReader::ParseProperty(DecoderBuffer *buffer) {
  if (elements_.empty()) {
    return false;  // Ignore properties if there is no active element.
  }
  DecoderBuffer line_buffer(*buffer);
  std::string line;
  parser::ParseLine(&line_buffer, &line);

  std::string data_type_str, list_type_str, property_name;
  bool property_search = false;
  const std::vector<std::string> words = SplitWords(line);
  if (words.size() >= 3 && words[0] == "property" && words[1] != "list") {
    property_search = true;
    data_type_str = words[1];
    property_name = words[2];
  }

  bool property_list_search = false;
  if (words.size() >= 5 && words[0] == "property" && words[1] == "list") {
    property_list_search = true;
    list_type_str = words[2];
    data_type_str = words[3];
    property_name = words[4];
  }
  if (!property_search && !property_list_search) {
    return false;
  }
  const DataType data_type = GetDataTypeFromString(data_type_str);
  if (data_type == DT_INVALID) {
    return Status(Status::INVALID_PARAMETER, "Wrong property data type");
  }
  DataType list_type = DT_INVALID;
  if (property_list_search) {
    list_type = GetDataTypeFromString(list_type_str);
    if (list_type == DT_INVALID) {
      return Status(Status::INVALID_PARAMETER, "Wrong property list type");
    }
  }
  elements_.back().AddProperty(
      PlyProperty(property_name, data_type, list_type));
  *buffer = line_buffer;
  return true;
}